

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O0

void __thiscall
ConfidentialTxOut_Constractor1_Test::TestBody(ConfidentialTxOut_Constractor1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Amount AVar4;
  AssertHelper local_830;
  Message local_828;
  int local_81c;
  int64_t local_818;
  undefined1 local_810;
  Amount local_808;
  int64_t local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_13;
  Message local_7d8;
  ByteData local_7d0;
  string local_7b8;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_12;
  Message local_780;
  ByteData local_778;
  string local_760;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_11;
  Message local_728;
  ConfidentialNonce local_720;
  string local_6f8;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_10;
  Message local_6c0;
  string local_6b8;
  Script local_698;
  string local_660;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_9;
  Message local_628;
  string local_620;
  ConfidentialValue local_600;
  string local_5d8;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar_8;
  Message local_5a0;
  string local_598;
  ConfidentialAssetId local_578;
  string local_550;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_7;
  ConfidentialTxOutReference txout_ref;
  Message local_420;
  int local_414;
  int64_t local_410;
  undefined1 local_408;
  Amount local_400;
  int64_t local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_6;
  Message local_3d0;
  ByteData local_3c8;
  string local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_5;
  Message local_378;
  ByteData local_370;
  string local_358;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_4;
  Message local_320;
  ConfidentialNonce local_318;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_3;
  Message local_2b8;
  string local_2b0;
  Script local_290;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  Message local_220;
  string local_218;
  ConfidentialValue local_1f8;
  string local_1d0;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  Message local_198;
  string local_190;
  ConfidentialAssetId local_160;
  string local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  ConfidentialTxOut_Constractor1_Test *this_local;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)&gtest_ar.message_,&exp_script,&exp_asset,&exp_value);
  cfd::core::ConfidentialTxOut::GetAsset(&local_160,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_138,&local_160);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_190,&exp_asset);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_118,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_138);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::ConfidentialTxOut::GetConfidentialValue
            (&local_1f8,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_1d0,&local_1f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_218,&exp_value);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b0,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d0);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  cfd::core::AbstractTxOut::GetLockingScript(&local_290,(AbstractTxOut *)&gtest_ar.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_258,&local_290);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_2b0,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_238,"txout.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_258);
  cfd::core::Script::~Script(&local_290);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  cfd::core::ConfidentialTxOut::GetNonce(&local_318,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_2f0,&local_318);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d0,"txout.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_2f0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  cfd::core::ConfidentialTxOut::GetRangeProof(&local_370,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_358,&local_370);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_338,"txout.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_358);
  cfd::core::ByteData::~ByteData(&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  cfd::core::ConfidentialTxOut::GetSurjectionProof
            (&local_3c8,(ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3b0,&local_3c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_390,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_3b0);
  cfd::core::ByteData::~ByteData(&local_3c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  AVar4 = cfd::core::AbstractTxOut::GetValue((AbstractTxOut *)&gtest_ar.message_);
  local_410 = AVar4.amount_;
  local_408 = AVar4.ignore_check_;
  local_400.amount_ = local_410;
  local_400.ignore_check_ = (bool)local_408;
  local_3f0 = cfd::core::Amount::GetSatoshiValue(&local_400);
  local_414 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_3e8,"txout.GetValue().GetSatoshiValue()","0",&local_3f0,
             &local_414);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_420);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txout_ref.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar_7.message_,
             (ConfidentialTxOut *)&gtest_ar.message_);
  cfd::core::ConfidentialTxOutReference::GetAsset
            (&local_578,(ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_550,&local_578);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_598,&exp_asset);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_530,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_550);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_578);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  cfd::core::ConfidentialTxOutReference::GetConfidentialValue
            (&local_600,(ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_5d8,&local_600);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_620,&exp_value);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5b8,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_5d8);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x52,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  cfd::core::AbstractTxOutReference::GetLockingScript
            (&local_698,(AbstractTxOutReference *)&gtest_ar_7.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_660,&local_698);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_6b8,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_640,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_660);
  cfd::core::Script::~Script(&local_698);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  cfd::core::ConfidentialTxOutReference::GetNonce
            (&local_720,(ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_6f8,&local_720);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6d8,"txout_ref.GetNonce().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_6f8);
  cfd::core::ConfidentialNonce::~ConfidentialNonce(&local_720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_728);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_728);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_728);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  cfd::core::ConfidentialTxOutReference::GetRangeProof
            (&local_778,(ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_760,&local_778);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_740,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_760);
  cfd::core::ByteData::~ByteData(&local_778);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  cfd::core::ConfidentialTxOutReference::GetSurjectionProof
            (&local_7d0,(ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_7b8,&local_7d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_798,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",pcVar2,
             "");
  std::__cxx11::string::~string((string *)&local_7b8);
  cfd::core::ByteData::~ByteData(&local_7d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  AVar4 = cfd::core::AbstractTxOutReference::GetValue
                    ((AbstractTxOutReference *)&gtest_ar_7.message_);
  local_818 = AVar4.amount_;
  local_810 = AVar4.ignore_check_;
  local_808.amount_ = local_818;
  local_808.ignore_check_ = (bool)local_810;
  local_7f8 = cfd::core::Amount::GetSatoshiValue(&local_808);
  local_81c = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((EqHelper<false> *)local_7f0,"txout_ref.GetValue().GetSatoshiValue()","0",&local_7f8,
             &local_81c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)&gtest_ar_7.message_);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor1) {
  // Script, ConfidentialAssetId, ConfidentialValue
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}